

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_verify.cpp
# Opt level: O3

pair<int,_long>
CalculateSequenceLocks
          (CTransaction *tx,int flags,vector<int,_std::allocator<int>_> *prevHeights,
          CBlockIndex *block)

{
  pointer piVar1;
  CBlockIndex **ppCVar2;
  int64_t iVar3;
  long lVar4;
  pointer pCVar5;
  uint uVar6;
  pointer pCVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  pair<int,_long> pVar13;
  CBlockIndex *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar7 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar5 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)(prevHeights->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(prevHeights->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start >> 2 !=
      ((long)pCVar5 - (long)pCVar7 >> 3) * 0x4ec4ec4ec4ec4ec5) {
    __assert_fail("prevHeights.size() == tx.vin.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/consensus/tx_verify.cpp"
                  ,0x29,
                  "std::pair<int, int64_t> CalculateSequenceLocks(const CTransaction &, int, std::vector<int> &, const CBlockIndex &)"
                 );
  }
  lVar8 = -1;
  uVar11 = 0xffffffff;
  if ((((flags & 1U) != 0) && (1 < tx->version)) && (pCVar5 != pCVar7)) {
    lVar10 = 0x12;
    uVar12 = 0;
    do {
      uVar6 = *(uint *)((pCVar7->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
                       lVar10 * 4);
      piVar1 = (prevHeights->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((int)uVar6 < 0) {
        piVar1[uVar12] = 0;
      }
      else {
        iVar9 = piVar1[uVar12];
        if ((uVar6 >> 0x16 & 1) == 0) {
          uVar6 = ((uVar6 & 0xffff) + iVar9) - 1;
          if ((int)uVar11 <= (int)uVar6) {
            uVar11 = uVar6;
          }
        }
        else {
          if (iVar9 < 2) {
            iVar9 = 1;
          }
          local_40 = CBlockIndex::GetAncestor(block,iVar9 + -1);
          ppCVar2 = inline_assertion_check<true,CBlockIndex_const*>
                              (&local_40,
                               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/consensus/tx_verify.cpp"
                               ,0x4a,"CalculateSequenceLocks",
                               "block.GetAncestor(std::max(nCoinHeight - 1, 0))");
          iVar3 = CBlockIndex::GetMedianTimePast(*ppCVar2);
          lVar4 = iVar3 + (ulong)((*(uint *)((pCVar7->prevout).hash.m_wrapped.super_base_blob<256U>.
                                             m_data._M_elems + lVar10 * 4) & 0xffff) << 9) + -1;
          if (lVar8 <= lVar4) {
            lVar8 = lVar4;
          }
          pCVar7 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pCVar5 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        }
      }
      uVar12 = uVar12 + 1;
      lVar10 = lVar10 + 0x1a;
    } while (uVar12 < (ulong)(((long)pCVar5 - (long)pCVar7 >> 3) * 0x4ec4ec4ec4ec4ec5));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  pVar13._4_4_ = 0;
  pVar13.first = uVar11;
  pVar13.second = lVar8;
  return pVar13;
}

Assistant:

std::pair<int, int64_t> CalculateSequenceLocks(const CTransaction &tx, int flags, std::vector<int>& prevHeights, const CBlockIndex& block)
{
    assert(prevHeights.size() == tx.vin.size());

    // Will be set to the equivalent height- and time-based nLockTime
    // values that would be necessary to satisfy all relative lock-
    // time constraints given our view of block chain history.
    // The semantics of nLockTime are the last invalid height/time, so
    // use -1 to have the effect of any height or time being valid.
    int nMinHeight = -1;
    int64_t nMinTime = -1;

    bool fEnforceBIP68 = tx.version >= 2 && flags & LOCKTIME_VERIFY_SEQUENCE;

    // Do not enforce sequence numbers as a relative lock time
    // unless we have been instructed to
    if (!fEnforceBIP68) {
        return std::make_pair(nMinHeight, nMinTime);
    }

    for (size_t txinIndex = 0; txinIndex < tx.vin.size(); txinIndex++) {
        const CTxIn& txin = tx.vin[txinIndex];

        // Sequence numbers with the most significant bit set are not
        // treated as relative lock-times, nor are they given any
        // consensus-enforced meaning at this point.
        if (txin.nSequence & CTxIn::SEQUENCE_LOCKTIME_DISABLE_FLAG) {
            // The height of this input is not relevant for sequence locks
            prevHeights[txinIndex] = 0;
            continue;
        }

        int nCoinHeight = prevHeights[txinIndex];

        if (txin.nSequence & CTxIn::SEQUENCE_LOCKTIME_TYPE_FLAG) {
            const int64_t nCoinTime{Assert(block.GetAncestor(std::max(nCoinHeight - 1, 0)))->GetMedianTimePast()};
            // NOTE: Subtract 1 to maintain nLockTime semantics
            // BIP 68 relative lock times have the semantics of calculating
            // the first block or time at which the transaction would be
            // valid. When calculating the effective block time or height
            // for the entire transaction, we switch to using the
            // semantics of nLockTime which is the last invalid block
            // time or height.  Thus we subtract 1 from the calculated
            // time or height.

            // Time-based relative lock-times are measured from the
            // smallest allowed timestamp of the block containing the
            // txout being spent, which is the median time past of the
            // block prior.
            nMinTime = std::max(nMinTime, nCoinTime + (int64_t)((txin.nSequence & CTxIn::SEQUENCE_LOCKTIME_MASK) << CTxIn::SEQUENCE_LOCKTIME_GRANULARITY) - 1);
        } else {
            nMinHeight = std::max(nMinHeight, nCoinHeight + (int)(txin.nSequence & CTxIn::SEQUENCE_LOCKTIME_MASK) - 1);
        }
    }

    return std::make_pair(nMinHeight, nMinTime);
}